

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O3

bool __thiscall
crnlib::
hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
::insert_no_grow(hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
                 *this,insert_result *result,cluster_id *k,uint *v)

{
  raw_node *prVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  cluster_id *this_00;
  
  if ((this->m_values).m_size == 0) {
    return false;
  }
  uVar3 = (uint)((int)k->m_hash * -0x61c88647) >> ((byte)this->m_hash_shift & 0x1f);
  prVar1 = (this->m_values).m_p;
  this_00 = (cluster_id *)(prVar1 + uVar3);
  uVar4 = uVar3;
  if (prVar1[uVar3].m_bits[0x1c] == '\0') {
LAB_001478a4:
    if (this->m_grow_threshold <= this->m_num_valid) {
      return false;
    }
    (this_00->m_cells).m_p = (uint *)0x0;
    (this_00->m_cells).m_size = 0;
    (this_00->m_cells).m_capacity = 0;
    elemental_vector::increase_capacity
              ((elemental_vector *)this_00,(k->m_cells).m_size,false,4,(object_mover)0x0,false);
    uVar3 = (k->m_cells).m_size;
    (this_00->m_cells).m_size = uVar3;
    memcpy((this_00->m_cells).m_p,(k->m_cells).m_p,(ulong)uVar3 << 2);
    this_00->m_hash = k->m_hash;
    *(uint *)&this_00[1].m_cells.m_p = *v;
    *(undefined1 *)((long)&this_00[1].m_cells.m_p + 4) = 1;
    this->m_num_valid = this->m_num_valid + 1;
    bVar2 = true;
  }
  else {
    bVar2 = qdxt1::cluster_id::operator==(this_00,k);
    if (bVar2) {
      bVar2 = false;
    }
    else {
      uVar5 = (ulong)uVar3;
      do {
        if ((int)uVar5 == 0) {
          uVar5 = (ulong)((this->m_values).m_size - 1);
          this_00 = (cluster_id *)((this->m_values).m_p + uVar5);
        }
        else {
          uVar5 = (ulong)((int)uVar5 - 1);
          this_00 = (cluster_id *)&this_00[-2].m_hash;
        }
        uVar4 = (uint)uVar5;
        if (uVar3 == uVar4) {
          return false;
        }
        if (*(char *)((long)&this_00[1].m_cells.m_p + 4) == '\0') goto LAB_001478a4;
        bVar2 = qdxt1::cluster_id::operator==(this_00,k);
      } while (!bVar2);
      bVar2 = false;
    }
  }
  (result->first).m_pTable = this;
  (result->first).m_index = uVar4;
  result->second = bVar2;
  return true;
}

Assistant:

inline bool insert_no_grow(insert_result& result, const Key& k, const Value& v = Value()) {
    if (!m_values.size())
      return false;

    int index = hash_key(k);
    node* pNode = &get_node(index);

    if (pNode->state) {
      if (m_equals(pNode->first, k)) {
        result.first = iterator(*this, index);
        result.second = false;
        return true;
      }

      const int orig_index = index;

      for (;;) {
        if (!index) {
          index = m_values.size() - 1;
          pNode = &get_node(index);
        } else {
          index--;
          pNode--;
        }

        if (orig_index == index)
          return false;

        if (!pNode->state)
          break;

        if (m_equals(pNode->first, k)) {
          result.first = iterator(*this, index);
          result.second = false;
          return true;
        }
      }
    }

    if (m_num_valid >= m_grow_threshold)
      return false;

    construct_value_type(pNode, k, v);

    pNode->state = cStateValid;

    m_num_valid++;
    CRNLIB_ASSERT(m_num_valid <= m_values.size());

    result.first = iterator(*this, index);
    result.second = true;

    return true;
  }